

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O2

void __thiscall Renderer::writeImg(Renderer *this,uint32_t iteration)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  string local_90;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  string path;
  
  uVar1 = (uint)Config::width + (uint)Config::width * 2;
  uVar2 = uVar1 & 3;
  iVar3 = 4 - uVar2;
  if (uVar2 == 0) {
    iVar3 = 0;
  }
  iVar3 = iVar3 + uVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
             (ulong)((uint)Config::height * iVar3),
             (allocator_type *)
             &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  (*glad_glPixelStorei)(0xd05,4);
  (*glad_glReadBuffer)(0x404);
  (*glad_glReadPixels)
            (0,0,(GLsizei)Config::width,(GLsizei)Config::height,0x1907,0x1401,(void *)local_70);
  stbi__flip_vertically_on_write = 1;
  std::filesystem::__cxx11::path::path<char[14],std::filesystem::__cxx11::path>
            ((path *)&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
             (char (*) [14])"result-frames",auto_format);
  std::filesystem::create_directory
            ((path *)&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::filesystem::__cxx11::path::~path
            ((path *)&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"result-frames/",
             (allocator<char> *)&local_90);
  std::__cxx11::to_string(&local_90,iteration);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,".png");
  stbi_write_png((char *)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(uint)Config::width,
                 (uint)Config::height,3,(void *)local_70,iVar3);
  std::__cxx11::string::~string
            ((string *)
             &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  return;
}

Assistant:

void Renderer::writeImg(const std::uint32_t iteration) const
{
    GLsizei nbChannels = 3;
    GLsizei stride = nbChannels * Config::width;
    stride += (stride % 4) ? (4 - stride % 4) : 0;
    GLsizei bufferSize = stride * Config::height;
    std::vector<std::uint8_t> buffer(bufferSize);
    glPixelStorei(GL_PACK_ALIGNMENT, 4);
    glReadBuffer(GL_FRONT);
    glReadPixels(0, 0, Config::width, Config::height,
            GL_RGB, GL_UNSIGNED_BYTE, buffer.data());
    stbi_flip_vertically_on_write(true);
    std::filesystem::create_directory("result-frames");
    std::string path = "result-frames/";
    path += std::to_string(iteration);
    path += ".png";
    stbi_write_png(path.c_str(), Config::width, Config::height,
            nbChannels, buffer.data(), stride);
}